

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smm_helper.c
# Opt level: O3

void helper_rsm_x86_64(CPUX86State *env)

{
  CPUState *cs;
  byte *pbVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  hwaddr addr;
  CPUX86State *__mptr;
  int iVar9;
  ulong uVar10;
  uint32_t *puVar11;
  
  cs = (CPUState *)(env[-6].mtrr_var + 4);
  uVar10 = (ulong)(env->smbase + 0x8000);
  uVar5 = x86_ldq_phys_x86_64(cs,uVar10 + 0x7ed0);
  env->efer = uVar5;
  env->hflags = ((uint)uVar5 & 0x1000) << 8 | ((uint)uVar5 & 0x400) << 4 | env->hflags & 0xffefbfff;
  uVar5 = x86_ldq_phys_x86_64(cs,uVar10 + 0x7e68);
  (env->gdt).base = uVar5;
  uVar2 = x86_ldl_phys_x86_64(cs,uVar10 + 0x7e64);
  (env->gdt).limit = uVar2;
  uVar2 = x86_lduw_phys_x86_64(cs,uVar10 + 0x7e70);
  (env->ldt).selector = uVar2;
  uVar5 = x86_ldq_phys_x86_64(cs,uVar10 + 0x7e78);
  (env->ldt).base = uVar5;
  uVar2 = x86_ldl_phys_x86_64(cs,uVar10 + 0x7e74);
  (env->ldt).limit = uVar2;
  uVar2 = x86_lduw_phys_x86_64(cs,uVar10 + 0x7e72);
  (env->ldt).flags = (uVar2 & 0xf0ff) << 8;
  uVar5 = x86_ldq_phys_x86_64(cs,uVar10 + 0x7e88);
  (env->idt).base = uVar5;
  uVar2 = x86_ldl_phys_x86_64(cs,uVar10 + 0x7e84);
  (env->idt).limit = uVar2;
  uVar2 = x86_lduw_phys_x86_64(cs,uVar10 + 0x7e90);
  (env->tr).selector = uVar2;
  uVar5 = x86_ldq_phys_x86_64(cs,uVar10 + 0x7e98);
  (env->tr).base = uVar5;
  uVar2 = x86_ldl_phys_x86_64(cs,uVar10 + 0x7e94);
  (env->tr).limit = uVar2;
  uVar2 = x86_lduw_phys_x86_64(cs,uVar10 + 0x7e92);
  (env->tr).flags = (uVar2 & 0xf0ff) << 8;
  uVar5 = x86_ldq_phys_x86_64(cs,uVar10 + 0x7ff8);
  env->regs[0] = uVar5;
  uVar5 = x86_ldq_phys_x86_64(cs,uVar10 + 0x7ff0);
  env->regs[1] = uVar5;
  uVar5 = x86_ldq_phys_x86_64(cs,uVar10 + 0x7fe8);
  env->regs[2] = uVar5;
  uVar5 = x86_ldq_phys_x86_64(cs,uVar10 + 0x7fe0);
  env->regs[3] = uVar5;
  uVar5 = x86_ldq_phys_x86_64(cs,uVar10 + 0x7fd8);
  env->regs[4] = uVar5;
  uVar5 = x86_ldq_phys_x86_64(cs,uVar10 + 0x7fd0);
  env->regs[5] = uVar5;
  uVar5 = x86_ldq_phys_x86_64(cs,uVar10 + 0x7fc8);
  env->regs[6] = uVar5;
  uVar5 = x86_ldq_phys_x86_64(cs,uVar10 + 0x7fc0);
  env->regs[7] = uVar5;
  addr = uVar10 + 0x7fb8;
  lVar8 = 8;
  do {
    uVar5 = x86_ldq_phys_x86_64(cs,addr);
    env->regs[lVar8] = uVar5;
    lVar8 = lVar8 + 1;
    addr = addr - 8;
  } while (lVar8 != 0x10);
  uVar5 = x86_ldq_phys_x86_64(cs,uVar10 + 0x7f78);
  env->eip = uVar5;
  uVar2 = x86_ldl_phys_x86_64(cs,uVar10 + 0x7f70);
  env->cc_src = (ulong)(uVar2 & 0x8d5);
  env->cc_op = 1;
  env->df = 1 - (uVar2 >> 9 & 2);
  env->eflags = (long)(int)(uVar2 & 0xfffff328 | 2) | (ulong)((uint)env->eflags & 0xcd5);
  uVar2 = x86_ldl_phys_x86_64(cs,uVar10 + 0x7f68);
  env->dr[6] = (ulong)uVar2;
  uVar2 = x86_ldl_phys_x86_64(cs,uVar10 + 0x7f60);
  env->dr[7] = (ulong)uVar2;
  uVar2 = x86_ldl_phys_x86_64(cs,uVar10 + 0x7f48);
  cpu_x86_update_cr4_x86_64(env,uVar2);
  uVar5 = x86_ldq_phys_x86_64(cs,uVar10 + 0x7f50);
  cpu_x86_update_cr3_x86_64(env,uVar5);
  uVar2 = x86_ldl_phys_x86_64(cs,uVar10 + 0x7f58);
  cpu_x86_update_cr0_x86_64(env,uVar2);
  puVar11 = &env->segs[0].flags;
  iVar9 = 0;
  lVar8 = 0;
  do {
    uVar2 = x86_lduw_phys_x86_64(cs,uVar10 + lVar8 + 0x7e00);
    uVar5 = x86_ldq_phys_x86_64(cs,uVar10 + lVar8 + 0x7e08);
    uVar3 = x86_ldl_phys_x86_64(cs,uVar10 + lVar8 + 0x7e04);
    uVar4 = x86_lduw_phys_x86_64(cs,uVar10 + lVar8 + 0x7e02);
    ((SegmentCache *)(puVar11 + -5))->selector = uVar2;
    *(uint64_t *)(puVar11 + -3) = uVar5;
    puVar11[-1] = uVar3;
    *puVar11 = uVar4 << 8 & 0xf0ff00;
    if (iVar9 == 2) {
      env->hflags = env->hflags & 0xfffffffc | (uVar4 << 8) >> 0xd & 3;
      cpu_sync_bndcs_hflags_x86_64(env);
    }
    else if (iVar9 == 1) {
      uVar6 = env->hflags;
      if ((uVar4 >> 0xd & 1) == 0 || (uVar6 >> 0xe & 1) == 0) {
        uVar6 = uVar6 & 0xffff7fef | env->segs[1].flags >> 0x12 & 0x10;
      }
      else {
        uVar6 = uVar6 & 0xffff7f8f | 0x8030;
      }
      env->hflags = uVar6;
    }
    uVar6 = env->hflags;
    uVar7 = env->segs[2].flags >> 0x11 & 0x20;
    if (-1 < (short)uVar6) {
      if ((((env->cr[0] & 1) == 0) || ((uVar6 & 0x10) == 0)) || ((env->eflags & 0x20000) != 0)) {
        uVar7 = uVar7 | 0x40;
      }
      else {
        uVar7 = uVar7 | (uint)((env->segs[0].base != 0 || env->segs[3].base != 0) ||
                              env->segs[2].base != 0) << 6;
      }
    }
    env->hflags = uVar6 & 0xffffff9f | uVar7;
    lVar8 = lVar8 + 0x10;
    iVar9 = iVar9 + 1;
    puVar11 = puVar11 + 6;
  } while (lVar8 != 0x60);
  uVar2 = x86_ldl_phys_x86_64(cs,uVar10 + 0x7efc);
  if ((uVar2 >> 0x11 & 1) != 0) {
    uVar2 = x86_ldl_phys_x86_64(cs,uVar10 + 0x7f00);
    env->smbase = uVar2;
  }
  uVar6 = env->hflags2;
  uVar7 = uVar6 & 0xffffffeb;
  if ((uVar6 & 0x10) != 0) {
    uVar7 = uVar6;
  }
  env->hflags2 = uVar7 & 0xffffffef;
  pbVar1 = (byte *)((long)&env->hflags + 2);
  *pbVar1 = *pbVar1 & 0xf7;
  return;
}

Assistant:

void helper_rsm(CPUX86State *env)
{
    CPUState *cs = env_cpu(env);
    target_ulong sm_state;
    int i, offset;
    uint32_t val;

    sm_state = env->smbase + 0x8000;
#ifdef TARGET_X86_64
    cpu_load_efer(env, x86_ldq_phys(cs, sm_state + 0x7ed0));

    env->gdt.base = x86_ldq_phys(cs, sm_state + 0x7e68);
    env->gdt.limit = x86_ldl_phys(cs, sm_state + 0x7e64);

    env->ldt.selector = x86_lduw_phys(cs, sm_state + 0x7e70);
    env->ldt.base = x86_ldq_phys(cs, sm_state + 0x7e78);
    env->ldt.limit = x86_ldl_phys(cs, sm_state + 0x7e74);
    env->ldt.flags = (x86_lduw_phys(cs, sm_state + 0x7e72) & 0xf0ff) << 8;

    env->idt.base = x86_ldq_phys(cs, sm_state + 0x7e88);
    env->idt.limit = x86_ldl_phys(cs, sm_state + 0x7e84);

    env->tr.selector = x86_lduw_phys(cs, sm_state + 0x7e90);
    env->tr.base = x86_ldq_phys(cs, sm_state + 0x7e98);
    env->tr.limit = x86_ldl_phys(cs, sm_state + 0x7e94);
    env->tr.flags = (x86_lduw_phys(cs, sm_state + 0x7e92) & 0xf0ff) << 8;

    env->regs[R_EAX] = x86_ldq_phys(cs, sm_state + 0x7ff8);
    env->regs[R_ECX] = x86_ldq_phys(cs, sm_state + 0x7ff0);
    env->regs[R_EDX] = x86_ldq_phys(cs, sm_state + 0x7fe8);
    env->regs[R_EBX] = x86_ldq_phys(cs, sm_state + 0x7fe0);
    env->regs[R_ESP] = x86_ldq_phys(cs, sm_state + 0x7fd8);
    env->regs[R_EBP] = x86_ldq_phys(cs, sm_state + 0x7fd0);
    env->regs[R_ESI] = x86_ldq_phys(cs, sm_state + 0x7fc8);
    env->regs[R_EDI] = x86_ldq_phys(cs, sm_state + 0x7fc0);
    for (i = 8; i < 16; i++) {
        env->regs[i] = x86_ldq_phys(cs, sm_state + 0x7ff8 - i * 8);
    }
    env->eip = x86_ldq_phys(cs, sm_state + 0x7f78);
    cpu_load_eflags(env, x86_ldl_phys(cs, sm_state + 0x7f70),
                    ~(CC_O | CC_S | CC_Z | CC_A | CC_P | CC_C | DF_MASK));
    env->dr[6] = x86_ldl_phys(cs, sm_state + 0x7f68);
    env->dr[7] = x86_ldl_phys(cs, sm_state + 0x7f60);

    cpu_x86_update_cr4(env, x86_ldl_phys(cs, sm_state + 0x7f48));
    cpu_x86_update_cr3(env, x86_ldq_phys(cs, sm_state + 0x7f50));
    cpu_x86_update_cr0(env, x86_ldl_phys(cs, sm_state + 0x7f58));

    for (i = 0; i < 6; i++) {
        offset = 0x7e00 + i * 16;
        cpu_x86_load_seg_cache(env, i,
                               x86_lduw_phys(cs, sm_state + offset),
                               x86_ldq_phys(cs, sm_state + offset + 8),
                               x86_ldl_phys(cs, sm_state + offset + 4),
                               (x86_lduw_phys(cs, sm_state + offset + 2) &
                                0xf0ff) << 8);
    }

    val = x86_ldl_phys(cs, sm_state + 0x7efc); /* revision ID */
    if (val & 0x20000) {
        env->smbase = x86_ldl_phys(cs, sm_state + 0x7f00);
    }
#else
    cpu_x86_update_cr0(env, x86_ldl_phys(cs, sm_state + 0x7ffc));
    cpu_x86_update_cr3(env, x86_ldl_phys(cs, sm_state + 0x7ff8));
    cpu_load_eflags(env, x86_ldl_phys(cs, sm_state + 0x7ff4),
                    ~(CC_O | CC_S | CC_Z | CC_A | CC_P | CC_C | DF_MASK));
    env->eip = x86_ldl_phys(cs, sm_state + 0x7ff0);
    env->regs[R_EDI] = x86_ldl_phys(cs, sm_state + 0x7fec);
    env->regs[R_ESI] = x86_ldl_phys(cs, sm_state + 0x7fe8);
    env->regs[R_EBP] = x86_ldl_phys(cs, sm_state + 0x7fe4);
    env->regs[R_ESP] = x86_ldl_phys(cs, sm_state + 0x7fe0);
    env->regs[R_EBX] = x86_ldl_phys(cs, sm_state + 0x7fdc);
    env->regs[R_EDX] = x86_ldl_phys(cs, sm_state + 0x7fd8);
    env->regs[R_ECX] = x86_ldl_phys(cs, sm_state + 0x7fd4);
    env->regs[R_EAX] = x86_ldl_phys(cs, sm_state + 0x7fd0);
    env->dr[6] = x86_ldl_phys(cs, sm_state + 0x7fcc);
    env->dr[7] = x86_ldl_phys(cs, sm_state + 0x7fc8);

    env->tr.selector = x86_ldl_phys(cs, sm_state + 0x7fc4) & 0xffff;
    env->tr.base = x86_ldl_phys(cs, sm_state + 0x7f64);
    env->tr.limit = x86_ldl_phys(cs, sm_state + 0x7f60);
    env->tr.flags = (x86_ldl_phys(cs, sm_state + 0x7f5c) & 0xf0ff) << 8;

    env->ldt.selector = x86_ldl_phys(cs, sm_state + 0x7fc0) & 0xffff;
    env->ldt.base = x86_ldl_phys(cs, sm_state + 0x7f80);
    env->ldt.limit = x86_ldl_phys(cs, sm_state + 0x7f7c);
    env->ldt.flags = (x86_ldl_phys(cs, sm_state + 0x7f78) & 0xf0ff) << 8;

    env->gdt.base = x86_ldl_phys(cs, sm_state + 0x7f74);
    env->gdt.limit = x86_ldl_phys(cs, sm_state + 0x7f70);

    env->idt.base = x86_ldl_phys(cs, sm_state + 0x7f58);
    env->idt.limit = x86_ldl_phys(cs, sm_state + 0x7f54);

    for (i = 0; i < 6; i++) {
        if (i < 3) {
            offset = 0x7f84 + i * 12;
        } else {
            offset = 0x7f2c + (i - 3) * 12;
        }
        cpu_x86_load_seg_cache(env, i,
                               x86_ldl_phys(cs,
                                        sm_state + 0x7fa8 + i * 4) & 0xffff,
                               x86_ldl_phys(cs, sm_state + offset + 8),
                               x86_ldl_phys(cs, sm_state + offset + 4),
                               (x86_ldl_phys(cs,
                                         sm_state + offset) & 0xf0ff) << 8);
    }
    cpu_x86_update_cr4(env, x86_ldl_phys(cs, sm_state + 0x7f14));

    val = x86_ldl_phys(cs, sm_state + 0x7efc); /* revision ID */
    if (val & 0x20000) {
        env->smbase = x86_ldl_phys(cs, sm_state + 0x7ef8);
    }
#endif
    if ((env->hflags2 & HF2_SMM_INSIDE_NMI_MASK) == 0) {
        env->hflags2 &= ~HF2_NMI_MASK;
    }
    env->hflags2 &= ~HF2_SMM_INSIDE_NMI_MASK;
    env->hflags &= ~HF_SMM_MASK;

    // qemu_log_mask(CPU_LOG_INT, "SMM: after RSM\n");
    // log_cpu_state_mask(CPU_LOG_INT, CPU(cpu), CPU_DUMP_CCOP);
}